

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O1

void ENUMS_EQUAL_INT_TEXTWithScopedIntEnumTestMethod_(void)

{
  UtestShell *pUVar1;
  char *pcVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString SStack_38;
  SimpleString local_28;
  
  pUVar1 = UtestShell::getCurrent();
  StringFrom((int)&local_28);
  pcVar2 = SimpleString::asCharString(&local_28);
  StringFrom((int)&SStack_38);
  pcVar3 = SimpleString::asCharString(&SStack_38);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x16])
            (pUVar1,1,pcVar2,pcVar3,"Failed because it failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
             ,0x4a9,pTVar4);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

static void ENUMS_EQUAL_INT_TEXTWithScopedIntEnumTestMethod_()
{
    ENUMS_EQUAL_INT_TEXT(ScopedIntEnum::B, ScopedIntEnum::A, "Failed because it failed");
}